

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O1

bool __thiscall FIX::Message::isAdmin(Message *this)

{
  bool bVar1;
  void *pvVar2;
  MsgType msgType;
  FieldBase local_70;
  
  StringField::StringField((StringField *)&local_70,0x23);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00185260;
  bVar1 = FieldMap::getFieldIfSet((FieldMap *)(this + 0x70),&local_70);
  if (bVar1 && local_70.m_string._M_string_length == 1) {
    pvVar2 = memchr("0A12345",(int)*local_70.m_string._M_dataplus._M_p,8);
    bVar1 = pvVar2 != (void *)0x0;
  }
  else {
    bVar1 = false;
  }
  FieldBase::~FieldBase(&local_70);
  return bVar1;
}

Assistant:

bool isAdmin() const
  { 
    MsgType msgType;
    if( m_header.getFieldIfSet( msgType ) )
      return isAdminMsgType( msgType );
    return false;
  }